

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ArrayMinMaxMethod::checkArguments
          (ArrayMinMaxMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  Compilation *this_00;
  bool bVar1;
  Type *type;
  QueueType *pQVar2;
  Diagnostic *this_01;
  SourceLocation SVar3;
  SourceLocation SVar4;
  SourceRange sourceRange;
  uint local_34;
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar1) {
    type = Type::getArrayElementType(((*args->_M_ptr)->type).ptr);
    if (iterExpr == (Expression *)0x0) {
      bVar1 = isComparable(type);
      if (bVar1) goto LAB_003d368e;
      SVar4 = ((*args->_M_ptr)->sourceRange).startLoc;
      SVar3 = ((*args->_M_ptr)->sourceRange).endLoc;
    }
    else {
      bVar1 = isComparable((iterExpr->type).ptr);
      if (bVar1) {
LAB_003d368e:
        local_34 = 0;
        pQVar2 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                           (&this_00->super_BumpAllocator,type,&local_34);
        return &pQVar2->super_Type;
      }
      SVar4 = (iterExpr->sourceRange).startLoc;
      SVar3 = (iterExpr->sourceRange).endLoc;
    }
    sourceRange.endLoc = SVar3;
    sourceRange.startLoc = SVar4;
    this_01 = ASTContext::addDiag(context,(DiagCode)0x1000b,sourceRange);
    Diagnostic::operator<<(this_01,&(this->super_SystemSubroutine).name);
  }
  return this_00->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        auto elemType = args[0]->type->getArrayElementType();
        SLANG_ASSERT(elemType);

        if (iterExpr) {
            if (!isComparable(*iterExpr->type)) {
                context.addDiag(diag::ArrayMethodComparable, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }
        }
        else if (!isComparable(*elemType)) {
            context.addDiag(diag::ArrayMethodComparable, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        return *comp.emplace<QueueType>(*elemType, 0u);
    }